

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O0

void apx_attributeParser_reset(apx_attributeParser_t *self)

{
  apx_attributeParser_t *self_local;
  
  if (self != (apx_attributeParser_t *)0x0) {
    self->last_error = 0;
    self->error_next = (uint8_t *)0x0;
    adt_stack_clear(&self->stack);
    if (self->state != (apx_attributeParseState_t *)0x0) {
      apx_attributeParseState_delete(self->state);
      self->state = (apx_attributeParseState_t *)0x0;
    }
    return;
  }
  __assert_fail("self != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                ,0x181,"void apx_attributeParser_reset(apx_attributeParser_t *)");
}

Assistant:

static void apx_attributeParser_reset(apx_attributeParser_t* self)
{
   assert(self != NULL);
   self->last_error = APX_NO_ERROR;
   self->error_next = NULL;
   adt_stack_clear(&self->stack);
   if (self->state != NULL)
   {
      apx_attributeParseState_delete(self->state);
      self->state = NULL;
   }
}